

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.h
# Opt level: O3

void __thiscall ON_3dmSettings::ON_3dmSettings(ON_3dmSettings *this)

{
  double dVar1;
  undefined3 uVar2;
  uint uVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 uVar7;
  
  ON_wString::ON_wString(&this->m_model_URL,&ON_wString::EmptyString);
  (this->m_model_basepoint).z = ON_3dPoint::Origin.z;
  dVar1 = ON_3dPoint::Origin.y;
  (this->m_model_basepoint).x = ON_3dPoint::Origin.x;
  (this->m_model_basepoint).y = dVar1;
  ON_EarthAnchorPoint::ON_EarthAnchorPoint(&this->m_earth_anchor_point,&ON_EarthAnchorPoint::Unset);
  dVar1 = ON_3dmUnitsAndTolerances::Millimeters.m_unit_system.m_meters_per_custom_unit;
  uVar2 = ON_3dmUnitsAndTolerances::Millimeters.m_unit_system._1_3_;
  uVar3 = ON_3dmUnitsAndTolerances::Millimeters.m_unit_system.m_reserved;
  (this->m_ModelUnitsAndTolerances).m_unit_system.m_unit_system =
       ON_3dmUnitsAndTolerances::Millimeters.m_unit_system.m_unit_system;
  *(undefined3 *)&(this->m_ModelUnitsAndTolerances).m_unit_system.field_0x1 = uVar2;
  (this->m_ModelUnitsAndTolerances).m_unit_system.m_reserved = uVar3;
  (this->m_ModelUnitsAndTolerances).m_unit_system.m_meters_per_custom_unit = dVar1;
  ON_wString::ON_wString
            (&(this->m_ModelUnitsAndTolerances).m_unit_system.m_custom_unit_name,
             &ON_3dmUnitsAndTolerances::Millimeters.m_unit_system.m_custom_unit_name);
  uVar5 = ON_3dmUnitsAndTolerances::Millimeters._48_8_;
  dVar4 = ON_3dmUnitsAndTolerances::Millimeters.m_angle_tolerance;
  dVar1 = ON_3dmUnitsAndTolerances::Millimeters.m_absolute_tolerance;
  (this->m_ModelUnitsAndTolerances).m_relative_tolerance =
       ON_3dmUnitsAndTolerances::Millimeters.m_relative_tolerance;
  uVar7 = ON_3dmUnitsAndTolerances::Millimeters._48_8_;
  ON_3dmUnitsAndTolerances::Millimeters.m_distance_display_mode =
       (OBSOLETE_DistanceDisplayMode)uVar5;
  ON_3dmUnitsAndTolerances::Millimeters._49_3_ = SUB83(uVar5,1);
  uVar2 = ON_3dmUnitsAndTolerances::Millimeters._49_3_;
  ON_3dmUnitsAndTolerances::Millimeters.m_distance_display_precision = SUB84(uVar5,4);
  iVar6 = ON_3dmUnitsAndTolerances::Millimeters.m_distance_display_precision;
  (this->m_ModelUnitsAndTolerances).m_distance_display_mode =
       ON_3dmUnitsAndTolerances::Millimeters.m_distance_display_mode;
  ON_3dmUnitsAndTolerances::Millimeters._48_8_ = uVar7;
  *(undefined3 *)&(this->m_ModelUnitsAndTolerances).field_0x31 = uVar2;
  (this->m_ModelUnitsAndTolerances).m_distance_display_precision = iVar6;
  (this->m_ModelUnitsAndTolerances).m_absolute_tolerance = dVar1;
  (this->m_ModelUnitsAndTolerances).m_angle_tolerance = dVar4;
  dVar1 = ON_3dmUnitsAndTolerances::Millimeters.m_unit_system.m_meters_per_custom_unit;
  uVar2 = ON_3dmUnitsAndTolerances::Millimeters.m_unit_system._1_3_;
  uVar3 = ON_3dmUnitsAndTolerances::Millimeters.m_unit_system.m_reserved;
  (this->m_PageUnitsAndTolerances).m_unit_system.m_unit_system =
       ON_3dmUnitsAndTolerances::Millimeters.m_unit_system.m_unit_system;
  *(undefined3 *)&(this->m_PageUnitsAndTolerances).m_unit_system.field_0x1 = uVar2;
  (this->m_PageUnitsAndTolerances).m_unit_system.m_reserved = uVar3;
  (this->m_PageUnitsAndTolerances).m_unit_system.m_meters_per_custom_unit = dVar1;
  ON_wString::ON_wString
            (&(this->m_PageUnitsAndTolerances).m_unit_system.m_custom_unit_name,
             &ON_3dmUnitsAndTolerances::Millimeters.m_unit_system.m_custom_unit_name);
  uVar5 = ON_3dmUnitsAndTolerances::Millimeters._48_8_;
  dVar4 = ON_3dmUnitsAndTolerances::Millimeters.m_angle_tolerance;
  dVar1 = ON_3dmUnitsAndTolerances::Millimeters.m_absolute_tolerance;
  (this->m_PageUnitsAndTolerances).m_relative_tolerance =
       ON_3dmUnitsAndTolerances::Millimeters.m_relative_tolerance;
  uVar7 = ON_3dmUnitsAndTolerances::Millimeters._48_8_;
  ON_3dmUnitsAndTolerances::Millimeters.m_distance_display_mode =
       (OBSOLETE_DistanceDisplayMode)uVar5;
  ON_3dmUnitsAndTolerances::Millimeters._49_3_ = SUB83(uVar5,1);
  uVar2 = ON_3dmUnitsAndTolerances::Millimeters._49_3_;
  ON_3dmUnitsAndTolerances::Millimeters.m_distance_display_precision = SUB84(uVar5,4);
  iVar6 = ON_3dmUnitsAndTolerances::Millimeters.m_distance_display_precision;
  (this->m_PageUnitsAndTolerances).m_distance_display_mode =
       ON_3dmUnitsAndTolerances::Millimeters.m_distance_display_mode;
  ON_3dmUnitsAndTolerances::Millimeters._48_8_ = uVar7;
  *(undefined3 *)&(this->m_PageUnitsAndTolerances).field_0x31 = uVar2;
  (this->m_PageUnitsAndTolerances).m_distance_display_precision = iVar6;
  (this->m_PageUnitsAndTolerances).m_absolute_tolerance = dVar1;
  (this->m_PageUnitsAndTolerances).m_angle_tolerance = dVar4;
  memcpy(&this->m_RenderMeshSettings,&ON_MeshParameters::DefaultMesh,0xe0);
  memcpy(&this->m_CustomRenderMeshSettings,&ON_MeshParameters::DefaultMesh,0xe0);
  memcpy(&this->m_AnalysisMeshSettings,&ON_MeshParameters::DefaultAnalysisMesh,0xe0);
  (this->m_AnnotationSettings).m_dimscale = 1.0;
  (this->m_AnnotationSettings).m_textheight = 1.0;
  (this->m_AnnotationSettings).m_dimexe = 1.0;
  (this->m_AnnotationSettings).m_dimexo = 1.0;
  (this->m_AnnotationSettings).m_arrowlength = 1.0;
  (this->m_AnnotationSettings).m_arrowwidth = 1.0;
  (this->m_AnnotationSettings).m_centermark = 1.0;
  (this->m_AnnotationSettings).m_private = (ON_3dmAnnotationSettingsPrivate *)0x0;
  (this->m_AnnotationSettings).m_b_V5_EnableAnnotationScaling = '\x01';
  (this->m_AnnotationSettings).m_bEnableModelSpaceAnnotationScaling = '\x01';
  (this->m_AnnotationSettings).m_bEnableLayoutSpaceAnnotationScaling = '\x01';
  (this->m_AnnotationSettings).m_bEnableHatchScaling = '\x01';
  (this->m_AnnotationSettings).m_reserved1 = 0;
  (this->m_AnnotationSettings).m_reserved2 = '\0';
  (this->m_AnnotationSettings).m_reserved3 = '\0';
  (this->m_AnnotationSettings).m_reserved4 = '\0';
  (this->m_AnnotationSettings).m_dimunits = None;
  (this->m_AnnotationSettings).m_arrowtype = 0;
  (this->m_AnnotationSettings).m_angularunits = 0;
  (this->m_AnnotationSettings).m_angularunits = 0;
  (this->m_AnnotationSettings).m_lengthformat = 0;
  (this->m_AnnotationSettings).m_angleformat = 0;
  (this->m_AnnotationSettings).m_resolution = 0;
  ON_wString::ON_wString(&(this->m_AnnotationSettings).m_facename);
  (this->m_named_cplanes)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0080af20;
  (this->m_named_cplanes).m_a = (ON_3dmConstructionPlane *)0x0;
  (this->m_named_cplanes).m_count = 0;
  (this->m_named_cplanes).m_capacity = 0;
  (this->m_named_views)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0080aed8;
  (this->m_named_views).m_a = (ON_3dmView *)0x0;
  (this->m_named_views).m_count = 0;
  (this->m_named_views).m_capacity = 0;
  (this->m_views)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0080aed8;
  (this->m_views).m_a = (ON_3dmView *)0x0;
  (this->m_views).m_count = 0;
  (this->m_views).m_capacity = 0;
  (this->m_active_view_id).Data1 = 0;
  (this->m_active_view_id).Data2 = 0;
  (this->m_active_view_id).Data3 = 0;
  (this->m_active_view_id).Data4[0] = '\0';
  (this->m_active_view_id).Data4[1] = '\0';
  (this->m_active_view_id).Data4[2] = '\0';
  (this->m_active_view_id).Data4[3] = '\0';
  (this->m_active_view_id).Data4[4] = '\0';
  (this->m_active_view_id).Data4[5] = '\0';
  (this->m_active_view_id).Data4[6] = '\0';
  (this->m_active_view_id).Data4[7] = '\0';
  this->m_V5_current_layer_index = -0x7fffffff;
  (this->m_current_layer_id).Data1 = 0;
  (this->m_current_layer_id).Data2 = 0;
  (this->m_current_layer_id).Data3 = 0;
  (this->m_current_layer_id).Data4[0] = '\0';
  (this->m_current_layer_id).Data4[1] = '\0';
  (this->m_current_layer_id).Data4[2] = '\0';
  (this->m_current_layer_id).Data4[3] = '\0';
  (this->m_current_layer_id).Data4[4] = '\0';
  (this->m_current_layer_id).Data4[5] = '\0';
  (this->m_current_layer_id).Data4[6] = '\0';
  (this->m_current_layer_id).Data4[7] = '\0';
  this->m_V5_current_render_material_index = -0x7fffffff;
  (this->m_current_render_material_id).Data1 = 0;
  (this->m_current_render_material_id).Data2 = 0;
  (this->m_current_render_material_id).Data3 = 0;
  (this->m_current_render_material_id).Data4[0] = '\0';
  (this->m_current_render_material_id).Data4[1] = '\0';
  (this->m_current_render_material_id).Data4[2] = '\0';
  (this->m_current_render_material_id).Data4[3] = '\0';
  (this->m_current_render_material_id).Data4[4] = '\0';
  (this->m_current_render_material_id).Data4[5] = '\0';
  (this->m_current_render_material_id).Data4[6] = '\0';
  (this->m_current_render_material_id).Data4[7] = '\0';
  this->m_current_material_source = material_from_layer;
  (this->m_current_color).field_0 = ON_Color::Black.field_0;
  this->m_current_color_source = color_from_layer;
  (this->m_current_plot_color).field_0 = ON_Color::UnsetColor.field_0;
  this->m_current_plot_color_source = plot_color_from_layer;
  this->m_V5_current_line_pattern_index = -0x7fffffff;
  (this->m_current_line_pattern_id).Data1 = 0;
  (this->m_current_line_pattern_id).Data2 = 0;
  (this->m_current_line_pattern_id).Data3 = 0;
  (this->m_current_line_pattern_id).Data4[0] = '\0';
  (this->m_current_line_pattern_id).Data4[1] = '\0';
  (this->m_current_line_pattern_id).Data4[2] = '\0';
  (this->m_current_line_pattern_id).Data4[3] = '\0';
  (this->m_current_line_pattern_id).Data4[4] = '\0';
  (this->m_current_line_pattern_id).Data4[5] = '\0';
  (this->m_current_line_pattern_id).Data4[6] = '\0';
  (this->m_current_line_pattern_id).Data4[7] = '\0';
  this->m_current_linetype_source = linetype_from_layer;
  this->m_V5_current_text_style_index = -0x7fffffff;
  (this->m_current_text_style_id).Data1 = 0;
  (this->m_current_text_style_id).Data2 = 0;
  (this->m_current_text_style_id).Data3 = 0;
  (this->m_current_text_style_id).Data4[0] = '\0';
  (this->m_current_text_style_id).Data4[1] = '\0';
  (this->m_current_text_style_id).Data4[2] = '\0';
  (this->m_current_text_style_id).Data4[3] = '\0';
  (this->m_current_text_style_id).Data4[4] = '\0';
  (this->m_current_text_style_id).Data4[5] = '\0';
  (this->m_current_text_style_id).Data4[6] = '\0';
  (this->m_current_text_style_id).Data4[7] = '\0';
  this->m_V5_current_dimension_style_index = -0x7fffffff;
  (this->m_current_dimension_style_id).Data1 = 0;
  (this->m_current_dimension_style_id).Data2 = 0;
  (this->m_current_dimension_style_id).Data3 = 0;
  (this->m_current_dimension_style_id).Data4[0] = '\0';
  (this->m_current_dimension_style_id).Data4[1] = '\0';
  (this->m_current_dimension_style_id).Data4[2] = '\0';
  (this->m_current_dimension_style_id).Data4[3] = '\0';
  (this->m_current_dimension_style_id).Data4[4] = '\0';
  (this->m_current_dimension_style_id).Data4[5] = '\0';
  (this->m_current_dimension_style_id).Data4[6] = '\0';
  (this->m_current_dimension_style_id).Data4[7] = '\0';
  (this->m_current_hatch_pattern_id).Data1 = 0;
  (this->m_current_hatch_pattern_id).Data2 = 0;
  (this->m_current_hatch_pattern_id).Data3 = 0;
  (this->m_current_hatch_pattern_id).Data4[0] = '\0';
  (this->m_current_hatch_pattern_id).Data4[1] = '\0';
  (this->m_current_hatch_pattern_id).Data4[2] = '\0';
  (this->m_current_hatch_pattern_id).Data4[3] = '\0';
  (this->m_current_hatch_pattern_id).Data4[4] = '\0';
  (this->m_current_hatch_pattern_id).Data4[5] = '\0';
  (this->m_current_hatch_pattern_id).Data4[6] = '\0';
  (this->m_current_hatch_pattern_id).Data4[7] = '\0';
  this->m_current_wire_density = 1;
  ON_3dmRenderSettings::ON_3dmRenderSettings(&this->m_RenderSettings,&ON_3dmRenderSettings::Default)
  ;
  (this->m_GridDefaults).m_grid_line_count = 0x46;
  (this->m_GridDefaults).m_grid_thick_frequency = 5;
  (this->m_GridDefaults).m_bShowGrid = true;
  (this->m_GridDefaults).m_bShowGridAxes = true;
  (this->m_GridDefaults).m_bShowWorldAxes = true;
  *(undefined5 *)&(this->m_GridDefaults).field_0x1b = 0;
  (this->m_GridDefaults).m_grid_spacing = 1.0;
  (this->m_GridDefaults).m_snap_spacing = 1.0;
  this->m_linetype_display_scale = 1.0;
  (this->m_plugin_list)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0080ae90;
  (this->m_plugin_list).m_a = (ON_PlugInRef *)0x0;
  (this->m_plugin_list).m_count = 0;
  (this->m_plugin_list).m_capacity = 0;
  (this->m_IO_settings).m_bSaveTextureBitmapsInFile = false;
  *(undefined3 *)&(this->m_IO_settings).field_0x1 = 0;
  (this->m_IO_settings).m_idef_link_update = 1;
  return;
}

Assistant:

~ON_3dmSettings() = default;